

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

void __thiscall
OpenMD::SquareMatrix3<double>::setupRotMat
          (SquareMatrix3<double> *this,double phi,double theta,double psi)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double cpsi;
  double ctheta;
  double cphi;
  double spsi;
  double stheta;
  double sphi;
  
  dVar1 = sin(in_XMM0_Qa);
  dVar2 = sin(in_XMM1_Qa);
  dVar3 = sin(in_XMM2_Qa);
  dVar4 = cos(in_XMM0_Qa);
  dVar5 = cos(in_XMM1_Qa);
  dVar6 = cos(in_XMM2_Qa);
  *in_RDI = dVar6 * dVar4 + -(dVar5 * dVar1 * dVar3);
  in_RDI[1] = dVar6 * dVar1 + dVar5 * dVar4 * dVar3;
  in_RDI[2] = dVar3 * dVar2;
  in_RDI[3] = -dVar3 * dVar4 + -(dVar5 * dVar1 * dVar6);
  in_RDI[4] = -dVar3 * dVar1 + dVar5 * dVar4 * dVar6;
  in_RDI[5] = dVar6 * dVar2;
  in_RDI[6] = dVar2 * dVar1;
  in_RDI[7] = -dVar2 * dVar4;
  in_RDI[8] = dVar5;
  return;
}

Assistant:

void setupRotMat(Real phi, Real theta, Real psi) {
      Real sphi, stheta, spsi;
      Real cphi, ctheta, cpsi;

      sphi   = sin(phi);
      stheta = sin(theta);
      spsi   = sin(psi);
      cphi   = cos(phi);
      ctheta = cos(theta);
      cpsi   = cos(psi);

      this->data_[0][0] = cpsi * cphi - ctheta * sphi * spsi;
      this->data_[0][1] = cpsi * sphi + ctheta * cphi * spsi;
      this->data_[0][2] = spsi * stheta;

      this->data_[1][0] = -spsi * cphi - ctheta * sphi * cpsi;
      this->data_[1][1] = -spsi * sphi + ctheta * cphi * cpsi;
      this->data_[1][2] = cpsi * stheta;

      this->data_[2][0] = stheta * sphi;
      this->data_[2][1] = -stheta * cphi;
      this->data_[2][2] = ctheta;
    }